

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_collate_expression.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,CollateExpression *expr,
          idx_t depth)

{
  pointer pcVar1;
  ClientContext *context;
  int iVar2;
  type expr_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  pointer pEVar3;
  CollationBinding *this_01;
  ParameterNotResolvedException *this_02;
  BinderException *this_03;
  pointer *__ptr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> collation_test;
  LogicalType collation_type;
  ErrorData error;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1b8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1b0;
  Value local_1a8;
  LogicalType local_168;
  string local_150;
  undefined1 local_130 [128];
  undefined1 local_b0 [128];
  
  Bind((ErrorData *)local_130,this,&expr->child,depth,false);
  if (local_130[0] == true) {
    local_b0._0_2_ = local_130._0_2_;
    if ((undefined1 *)local_130._8_8_ == local_130 + 0x18) {
      local_b0._32_4_ = local_130._32_4_;
      local_b0._36_4_ = local_130._36_4_;
      local_b0._8_8_ = local_b0 + 0x18;
    }
    else {
      local_b0._8_8_ = local_130._8_8_;
    }
    local_b0._16_8_ = local_130._16_8_;
    local_130._16_8_ = 0;
    local_130._24_4_ = local_130._24_4_ & 0xffffff00;
    if ((undefined1 *)local_130._40_8_ == local_130 + 0x38) {
      local_b0._64_4_ = local_130._64_4_;
      local_b0._68_4_ = local_130._68_4_;
      local_b0._40_8_ = local_b0 + 0x38;
    }
    else {
      local_b0._40_8_ = local_130._40_8_;
    }
    local_b0._48_8_ = local_130._48_8_;
    local_130._48_8_ = 0;
    local_130._56_4_ = local_130._56_4_ & 0xffffff00;
    local_130._8_8_ = local_130 + 0x18;
    local_130._40_8_ = local_130 + 0x38;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(local_b0 + 0x48),local_130 + 0x48);
    BindResult::BindResult(__return_storage_ptr__,(ErrorData *)local_b0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_b0 + 0x48));
    if ((undefined1 *)local_b0._40_8_ != local_b0 + 0x38) {
      operator_delete((void *)local_b0._40_8_);
    }
    if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
      operator_delete((void *)local_b0._8_8_);
    }
  }
  else {
    expr_00 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&expr->child);
    this_00 = BoundExpression::GetExpression(expr_00);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    iVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[6])(pEVar3);
    if ((char)iVar2 != '\0') {
      this_02 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_02);
      __cxa_throw(this_02,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    if ((pEVar3->return_type).id_ != VARCHAR) {
      this_03 = (BinderException *)__cxa_allocate_exception(0x10);
      local_1a8.type_._0_8_ =
           &local_1a8.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a8,"collations are only supported for type varchar","");
      BinderException::BinderException(this_03,(string *)&local_1a8);
      __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    LogicalType::LogicalType(&local_168,&pEVar3->return_type);
    Value::Value(&local_1a8,&local_168);
    make_uniq_base<duckdb::Expression,duckdb::BoundConstantExpression,duckdb::Value>
              ((duckdb *)&local_1b0,&local_1a8);
    Value::~Value(&local_1a8);
    LogicalType::~LogicalType(&local_168);
    pcVar1 = (expr->collation)._M_dataplus._M_p;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar1,pcVar1 + (expr->collation)._M_string_length);
    LogicalType::VARCHAR_COLLATION(&local_1a8.type_,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    context = this->context;
    this_01 = CollationBinding::Get(context);
    CollationBinding::PushCollation
              (this_01,context,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1b0,&local_1a8.type_,ALL_COLLATIONS);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    if (&pEVar3->return_type != &local_1a8.type_) {
      (pEVar3->return_type).id_ = local_1a8.type_.id_;
      (pEVar3->return_type).physical_type_ = local_1a8.type_.physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&(pEVar3->return_type).type_info_,&local_1a8.type_.type_info_);
    }
    local_1b8._M_head_impl =
         (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1b8);
    if (local_1b8._M_head_impl != (Expression *)0x0) {
      (*((local_1b8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_1b8._M_head_impl = (Expression *)0x0;
    LogicalType::~LogicalType(&local_1a8.type_);
    if (local_1b0._M_head_impl != (Expression *)0x0) {
      (*((local_1b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_130 + 0x48));
  if ((undefined1 *)local_130._40_8_ != local_130 + 0x38) {
    operator_delete((void *)local_130._40_8_);
  }
  if ((undefined1 *)local_130._8_8_ != local_130 + 0x18) {
    operator_delete((void *)local_130._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindExpression(CollateExpression &expr, idx_t depth) {
	// first try to bind the child of the cast expression
	auto error = Bind(expr.child, depth);
	if (error.HasError()) {
		return BindResult(std::move(error));
	}
	auto &child = BoundExpression::GetExpression(*expr.child);
	if (child->HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (child->return_type.id() != LogicalTypeId::VARCHAR) {
		throw BinderException("collations are only supported for type varchar");
	}
	// Validate the collation, but don't use it
	auto collation_test = make_uniq_base<Expression, BoundConstantExpression>(Value(child->return_type));
	auto collation_type = LogicalType::VARCHAR_COLLATION(expr.collation);
	PushCollation(context, collation_test, collation_type);
	child->return_type = collation_type;
	return BindResult(std::move(child));
}